

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglcompositor.cpp
# Opt level: O0

void __thiscall
QOpenGLCompositor::renderAll(QOpenGLCompositor *this,QOpenGLFramebufferObject *fbo,Origin origin)

{
  bool bVar1;
  int iVar2;
  socklen_t __len;
  qsizetype qVar3;
  const_reference ppQVar4;
  QList<QOpenGLCompositorWindow_*> *this_00;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  QOpenGLFramebufferObject *in_RSI;
  long in_RDI;
  Origin in_stack_00000034;
  QOpenGLCompositorWindow *in_stack_00000038;
  QOpenGLCompositor *in_stack_00000040;
  int i_2;
  int i_1;
  int i;
  QRect *in_stack_ffffffffffffff98;
  QList<QOpenGLCompositorWindow_*> *in_stack_ffffffffffffffa0;
  QOpenGLTextureBlitter *in_stack_ffffffffffffffb0;
  QOpenGLFramebufferObject *in_stack_ffffffffffffffb8;
  int local_20;
  int local_1c;
  int local_18;
  
  if (in_RSI != (QOpenGLFramebufferObject *)0x0) {
    QOpenGLFramebufferObject::bind(in_RSI,(int)in_RSI,in_RDX,in_ECX);
  }
  glClear(0x4500);
  iVar2 = QRect::width(in_stack_ffffffffffffff98);
  __len = QRect::height(in_stack_ffffffffffffff98);
  glViewport(0,0,iVar2);
  bVar1 = QOpenGLTextureBlitter::isCreated((QOpenGLTextureBlitter *)in_stack_ffffffffffffffa0);
  __addr = extraout_RDX;
  if (!bVar1) {
    QOpenGLTextureBlitter::create((QOpenGLTextureBlitter *)in_stack_ffffffffffffffb8);
    __addr = extraout_RDX_00;
  }
  QOpenGLTextureBlitter::bind((QOpenGLTextureBlitter *)(in_RDI + 0x88),0xde1,__addr,__len);
  for (local_18 = 0;
      qVar3 = QList<QOpenGLCompositorWindow_*>::size
                        ((QList<QOpenGLCompositorWindow_*> *)(in_RDI + 0x90)), local_18 < qVar3;
      local_18 = local_18 + 1) {
    ppQVar4 = QList<QOpenGLCompositorWindow_*>::at
                        (in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    (**(code **)(*(long *)*ppQVar4 + 0x20))();
  }
  for (local_1c = 0;
      qVar3 = QList<QOpenGLCompositorWindow_*>::size
                        ((QList<QOpenGLCompositorWindow_*> *)(in_RDI + 0x90)), local_1c < qVar3;
      local_1c = local_1c + 1) {
    QList<QOpenGLCompositorWindow_*>::at
              (in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
    render(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  }
  QOpenGLTextureBlitter::release(in_stack_ffffffffffffffb0);
  if (in_RSI == (QOpenGLFramebufferObject *)0x0) {
    QOpenGLContext::swapBuffers(*(QSurface **)(in_RDI + 0x10));
  }
  else {
    QOpenGLFramebufferObject::release(in_stack_ffffffffffffffb8);
  }
  local_20 = 0;
  while( true ) {
    this_00 = (QList<QOpenGLCompositorWindow_*> *)(long)local_20;
    qVar3 = QList<QOpenGLCompositorWindow_*>::size
                      ((QList<QOpenGLCompositorWindow_*> *)(in_RDI + 0x90));
    if (qVar3 <= (long)this_00) break;
    ppQVar4 = QList<QOpenGLCompositorWindow_*>::at(this_00,(qsizetype)in_stack_ffffffffffffff98);
    (**(code **)(*(long *)*ppQVar4 + 0x28))();
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void QOpenGLCompositor::renderAll(QOpenGLFramebufferObject *fbo, QOpenGLTextureBlitter::Origin origin)
{
    if (fbo)
        fbo->bind();

    glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
    glViewport(0, 0, m_nativeTargetGeometry.width(), m_nativeTargetGeometry.height());

    if (!m_blitter.isCreated())
        m_blitter.create();

    m_blitter.bind();

    for (int i = 0; i < m_windows.size(); ++i)
        m_windows.at(i)->beginCompositing();

    for (int i = 0; i < m_windows.size(); ++i)
        render(m_windows.at(i), origin);

    m_blitter.release();
    if (!fbo)
        m_context->swapBuffers(m_targetWindow);
    else
        fbo->release();

    for (int i = 0; i < m_windows.size(); ++i)
        m_windows.at(i)->endCompositing();
}